

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

_Bool check_noproxy(char *name,char *no_proxy)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  
  if ((no_proxy != (char *)0x0) && (*no_proxy != '\0')) {
    iVar1 = Curl_raw_equal("*",no_proxy);
    if (iVar1 != 0) {
      return true;
    }
    sVar2 = strlen(no_proxy);
    pcVar3 = strchr(name,0x3a);
    if (pcVar3 == (char *)0x0) {
      sVar7 = strlen(name);
    }
    else {
      sVar7 = (long)pcVar3 - (long)name;
    }
    uVar4 = 0;
    while (uVar4 < sVar2) {
      while( true ) {
        if (uVar4 == sVar2) {
          return false;
        }
        if ((0x2c < (ulong)(byte)no_proxy[uVar4]) ||
           ((0x100100000001U >> ((ulong)(byte)no_proxy[uVar4] & 0x3f) & 1) == 0)) break;
        uVar4 = uVar4 + 1;
      }
      if (uVar4 == sVar2) {
        return false;
      }
      sVar8 = uVar4;
      sVar5 = uVar4;
      if (uVar4 < sVar2) {
        sVar5 = sVar2;
      }
      while ((sVar9 = sVar5, sVar5 != sVar8 &&
             ((0x2c < (ulong)(byte)no_proxy[sVar8] ||
              (sVar9 = sVar8, (0x100100000001U >> ((ulong)(byte)no_proxy[sVar8] & 0x3f) & 1) == 0)))
             )) {
        sVar8 = sVar8 + 1;
      }
      lVar6 = (no_proxy[uVar4] == '.') + uVar4;
      uVar4 = sVar9 - lVar6;
      if (uVar4 <= sVar7) {
        iVar1 = Curl_raw_nequal(no_proxy + lVar6,name + (sVar7 - uVar4),uVar4);
        if (iVar1 != 0) {
          if (uVar4 == sVar7) {
            return true;
          }
          if ((name + (sVar7 - uVar4))[-1] == '.') {
            return true;
          }
        }
      }
      uVar4 = sVar9 + 1;
    }
  }
  return false;
}

Assistant:

static bool check_noproxy(const char* name, const char* no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  size_t tok_start;
  size_t tok_end;
  const char* separator = ", ";
  size_t no_proxy_len;
  size_t namelen;
  char *endptr;

  if(no_proxy && no_proxy[0]) {
    if(Curl_raw_equal("*", no_proxy)) {
      return TRUE;
    }

    /* NO_PROXY was specified and it wasn't just an asterisk */

    no_proxy_len = strlen(no_proxy);
    endptr = strchr(name, ':');
    if(endptr)
      namelen = endptr - name;
    else
      namelen = strlen(name);

    for(tok_start = 0; tok_start < no_proxy_len; tok_start = tok_end + 1) {
      while(tok_start < no_proxy_len &&
            strchr(separator, no_proxy[tok_start]) != NULL) {
        /* Look for the beginning of the token. */
        ++tok_start;
      }

      if(tok_start == no_proxy_len)
        break; /* It was all trailing separator chars, no more tokens. */

      for(tok_end = tok_start; tok_end < no_proxy_len &&
            strchr(separator, no_proxy[tok_end]) == NULL; ++tok_end)
        /* Look for the end of the token. */
        ;

      /* To match previous behaviour, where it was necessary to specify
       * ".local.com" to prevent matching "notlocal.com", we will leave
       * the '.' off.
       */
      if(no_proxy[tok_start] == '.')
        ++tok_start;

      if((tok_end - tok_start) <= namelen) {
        /* Match the last part of the name to the domain we are checking. */
        const char *checkn = name + namelen - (tok_end - tok_start);
        if(Curl_raw_nequal(no_proxy + tok_start, checkn,
                           tok_end - tok_start)) {
          if((tok_end - tok_start) == namelen || *(checkn - 1) == '.') {
            /* We either have an exact match, or the previous character is a .
             * so it is within the same domain, so no proxy for this host.
             */
            return TRUE;
          }
        }
      } /* if((tok_end - tok_start) <= namelen) */
    } /* for(tok_start = 0; tok_start < no_proxy_len;
         tok_start = tok_end + 1) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}